

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall sznet::net::EventLoop::doPendingFunctors(EventLoop *this)

{
  MutexLock *mutex;
  _Any_data *p_Var1;
  pointer pfVar2;
  pointer pfVar3;
  undefined8 uVar4;
  undefined1 auVar5 [8];
  undefined1 auStack_38 [8];
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  
  mutex = &this->m_mutex;
  functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_38 = (undefined1  [8])0x0;
  functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->m_callingPendingFunctors = true;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  p_Var1 = (_Any_data *)
           (this->m_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->m_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pfVar3 = (this->m_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_38;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_mutex).m_holder = 0;
  auStack_38 = (undefined1  [8])p_Var1;
  functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pfVar2;
  functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar3;
  sz_mutex_unlock(&mutex->m_mutex);
  pfVar2 = functors.
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  auVar5 = auStack_38;
  while( true ) {
    if (auVar5 == (undefined1  [8])pfVar2) {
      this->m_callingPendingFunctors = false;
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                 auStack_38);
      return;
    }
    if (*(long *)((long)auVar5 + 0x10) == 0) break;
    (**(code **)((long)auVar5 + 0x18))((_Any_data *)auVar5);
    auVar5 = (undefined1  [8])((long)auVar5 + 0x20);
  }
  uVar4 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar4);
}

Assistant:

void EventLoop::doPendingFunctors()
{
	std::vector<Functor> functors;
	m_callingPendingFunctors = true;

	{
		MutexLockGuard lock(m_mutex);
		// 不是简单地在临界区依次调用Functor，而是把回调列表swap()到局部变量functors中，
		// 这样做，一方面减小了临界区的长度(不会阻塞其他线程调用queueInLoop())，
		// 另一方面避免了死锁(因为Functor可能再调用queueInLoop())。
		functors.swap(m_pendingFunctors);
	}

	for (const Functor& functor : functors)
	{
		functor();
	}

	m_callingPendingFunctors = false;
}